

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgap_dictionary.h
# Opt level: O2

void __thiscall
bwtil::cgap_dictionary::cgap_dictionary
          (cgap_dictionary *this,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *gaps)

{
  _Bit_iterator_base *p_Var1;
  uint *puVar2;
  _Rb_tree_header *p_Var3;
  undefined1 auVar4 [16];
  char cVar5;
  pointer pvVar6;
  byte bVar7;
  pointer ppVar8;
  long lVar9;
  ulint uVar10;
  mapped_type *this_00;
  ulong *puVar11;
  uint *puVar12;
  ulong uVar13;
  ulong *puVar14;
  ulint i;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulint p;
  pointer pvVar18;
  ulint uVar19;
  uint uVar20;
  long lVar21;
  iterator __end2;
  pointer ppVar22;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range2;
  ulong uVar23;
  iterator __begin2;
  pointer ppVar24;
  pointer puVar25;
  uint uVar26;
  ulint p_1;
  ulint uVar27;
  pointer size;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar30 [64];
  reference rVar31;
  allocator_type local_f1;
  packed_view<std::vector> *local_f0;
  HuffmanTree<unsigned_long> ht;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  codes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  vector<bool,_std::allocator<bool>_> c;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  auVar29 = in_ZMM1._0_16_;
  p_Var3 = &(this->encoding)._M_t._M_impl.super__Rb_tree_header;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0 = &this->H_len;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->H_val)._size = 0;
  (this->H_val)._width = 0;
  (this->H_val)._field_mask = 0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->H_len)._size = 0;
  (this->H_len)._width = 0;
  (this->H_len)._field_mask = 0;
  (this->H_long).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->H_long).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_long).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->prefix_length = '\0';
  this->log2_max_gap = 0;
  ppVar22 = (gaps->
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  ppVar24 = (gaps->
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((long)ppVar22 - (long)ppVar24 == 0x10) {
    ht.sigma_0 = ppVar24->first + 1;
    ht.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    ::std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<std::pair<unsigned_long,unsigned_long>>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)gaps,(pair<unsigned_long,_unsigned_long> *)&ht);
    ppVar24 = (gaps->
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar22 = (gaps->
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar19 = 0;
  lVar15 = 0;
  for (ppVar8 = ppVar24; ppVar8 != ppVar22; ppVar8 = ppVar8 + 1) {
    lVar15 = lVar15 + ppVar8->second;
    if (uVar19 < ppVar8->first) {
      uVar19 = ppVar8->first;
    }
  }
  auVar30 = ZEXT1664(auVar29);
  bVar7 = intlog2(uVar19);
  this->log2_max_gap = (ulong)bVar7;
  codes.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  codes.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  codes.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (; ppVar24 != ppVar22; ppVar24 = ppVar24 + 1) {
    ht.sigma_0 = ppVar24->first;
    ht.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppVar24->second;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&freqs,(value_type *)&ht.frequencies);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,&freqs);
  HuffmanTree<unsigned_long>::HuffmanTree
            (&ht,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)&c,&ht.codes);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::_M_move_assign(&codes,&c.super__Bvector_base<std::allocator<bool>_>);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)&c.super__Bvector_base<std::allocator<bool>_>);
  pvVar6 = codes.
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar18 = codes.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar18 != pvVar6; pvVar18 = pvVar18 + 1
      ) {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&c.super__Bvector_base<std::allocator<bool>_>,
               pvVar18);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&c.super__Bvector_base<std::allocator<bool>_>);
  }
  HuffmanTree<unsigned_long>::~HuffmanTree(&ht);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  ht.sigma_0 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&c,0x40,&ht.sigma_0,
             (allocator_type *)&freqs);
  pvVar6 = codes.
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar18 = codes.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; auVar29 = auVar30._0_16_,
      pvVar18 != pvVar6; pvVar18 = pvVar18 + 1) {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&ht,pvVar18);
    for (lVar16 = 0;
        (ulong)(uint)ht.frequencies.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage +
        ((long)ht.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish - ht.sigma_0) * 8 != lVar16;
        lVar16 = lVar16 + 1) {
      c.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[lVar16] =
           c.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p[lVar16] + 1;
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&ht);
  }
  freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&ht,0x40,(value_type_conflict2 *)&freqs,
             &local_f1);
  puVar12 = &((codes.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_offset;
  lVar9 = ((long)codes.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)codes.
                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  lVar16 = 8;
  while (bVar28 = lVar9 != 0, lVar9 = lVar9 + -1, bVar28) {
    p_Var1 = (_Bit_iterator_base *)(puVar12 + -2);
    uVar26 = *puVar12;
    auVar4 = vcvtusi2sd_avx512f(auVar29,*(undefined8 *)
                                         ((long)&((gaps->
                                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                         + lVar16));
    lVar16 = lVar16 + 0x10;
    puVar2 = puVar12 + -6;
    puVar12 = puVar12 + 10;
    lVar21 = ((long)p_Var1->_M_p - *(long *)puVar2) * 0x40 + ht.sigma_0;
    *(double *)(lVar21 + (ulong)uVar26 * 8) = auVar4._0_8_ + *(double *)(lVar21 + (ulong)uVar26 * 8)
    ;
  }
  uVar13 = (long)((long)ht.frequencies.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start - ht.sigma_0) >> 3;
  for (uVar17 = 1; uVar17 < uVar13; uVar17 = uVar17 + 1) {
    *(double *)(ht.sigma_0 + uVar17 * 8) =
         *(double *)(ht.sigma_0 + uVar17 * 8) + *(double *)((ht.sigma_0 - 8) + uVar17 * 8);
  }
  auVar29 = vcvtusi2sd_avx512f(auVar29,lVar15);
  for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
    *(double *)(ht.sigma_0 + uVar17 * 8) =
         *(double *)(ht.sigma_0 + uVar17 * 8) * 100.0 * (1.0 / auVar29._0_8_);
  }
  uVar27 = 0x8000000000000000;
  this->prefix_length = '\x01';
  for (uVar19 = 1; uVar19 != 0x1e; uVar19 = uVar19 + 1) {
    uVar10 = assess_bitsize(this,uVar19,
                            c.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar19])
    ;
    if (uVar10 < uVar27) {
      uVar27 = assess_bitsize(this,uVar19,
                              c.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              [uVar19]);
      this->prefix_length = (uint8_t)uVar19;
    }
  }
  for (uVar19 = 1; uVar19 != 0x1e; uVar19 = uVar19 + 1) {
    uVar10 = assess_bitsize(this,uVar19,
                            c.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar19])
    ;
    if (uVar10 <= (uVar27 * 0x14) / 100 + uVar27) {
      this->prefix_length = (uint8_t)uVar19;
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&ht);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&c);
  lVar16 = 0;
  lVar15 = 0;
  uVar17 = 0;
  while( true ) {
    pvVar6 = codes.
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)codes.
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)codes.
                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= uVar17) break;
    this_00 = std::
              map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
              ::operator[](&this->encoding,
                           (key_type *)
                           ((long)&((gaps->
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->first + lVar15));
    std::vector<bool,_std::allocator<bool>_>::operator=
              (this_00,(vector<bool,_std::allocator<bool>_> *)
                       ((long)&(pvVar6->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       lVar16));
    uVar17 = uVar17 + 1;
    lVar15 = lVar15 + 0x10;
    lVar16 = lVar16 + 0x28;
  }
  size = (pointer)(1L << ((ulong)this->prefix_length & 0x3f));
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)&ht,this->log2_max_gap,(size_t)size);
  bv::internal::packed_view<std::vector>::operator=(&this->H_val,(packed_view<std::vector> *)&ht);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ht);
  bVar7 = intlog2((ulong)this->prefix_length);
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)&ht,(ulong)bVar7,(size_t)size);
  bv::internal::packed_view<std::vector>::operator=(local_f0,(packed_view<std::vector> *)&ht);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ht);
  for (puVar25 = (pointer)0x0; size != puVar25; puVar25 = (pointer)((long)puVar25 + 1)) {
    ht.sigma_0 = (unsigned_long)local_f0;
    ht.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = puVar25;
    bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
              ((item_reference<bv::internal::packed_view<std::vector>_> *)&ht,0);
  }
  for (uVar17 = 0;
      uVar17 < (ulong)((long)(gaps->
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(gaps->
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4); uVar17 = uVar17 + 1)
  {
    puVar11 = codes.
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17].
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
              super__Bit_iterator_base._M_p;
    puVar14 = codes.
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17].
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
              super__Bit_iterator_base._M_p;
    uVar26 = codes.
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar17].
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_offset;
    uVar23 = (ulong)uVar26;
    uVar13 = uVar23 + ((long)puVar11 - (long)puVar14) * 8;
    bVar7 = this->prefix_length;
    if (bVar7 < uVar13) {
      lVar15 = 0;
      uVar26 = 0;
      while( true ) {
        uVar23 = uVar23 + ((long)puVar11 - (long)puVar14) * 8;
        if (uVar23 <= uVar26) break;
        rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (codes.
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar17,(ulong)uVar26);
        puVar11 = codes.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar17].
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_finish.super__Bit_iterator_base._M_p;
        uVar23 = (ulong)codes.
                        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar17].
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_finish.super__Bit_iterator_base._M_offset;
        uVar26 = uVar26 + 1;
        lVar15 = (ulong)((*rVar31._M_p & rVar31._M_mask) != 0) + lVar15 * 2;
        puVar14 = codes.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar17].
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_start.super__Bit_iterator_base._M_p;
      }
      cVar5 = (char)uVar23;
      ht.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar15 << ((ulong)(byte)-cVar5 & 0x3f));
      ht.sigma_0 = CONCAT71(ht.sigma_0._1_7_,cVar5);
      ht.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(gaps->
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar17].first;
      ::std::
      vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>
      ::emplace_back<std::tuple<unsigned_long,unsigned_long,unsigned_char>>
                ((vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>
                  *)&this->H_long,(tuple<unsigned_long,_unsigned_long,_unsigned_char> *)&ht);
    }
    else {
      uVar23 = 0;
      lVar15 = 0;
      while ((uVar20 = (uint)uVar23, puVar14 != puVar11 || (uVar20 != uVar26))) {
        lVar15 = (ulong)((uint)(*puVar14 >> (uVar23 & 0x3f)) & 1) + lVar15 * 2;
        uVar23 = (ulong)(uVar20 + 1);
        if (uVar20 == 0x3f) {
          uVar23 = 0;
        }
        puVar14 = puVar14 + (uVar20 == 0x3f);
      }
      uVar26 = (uint)bVar7;
      for (uVar23 = 0; uVar23 >> ((ulong)((uint)bVar7 - (int)uVar13) & 0x3f) == 0;
          uVar23 = uVar23 + 1) {
        puVar25 = (pointer)((lVar15 << ((ulong)(uVar26 - (int)uVar13) & 0x3f)) + uVar23);
        ht.sigma_0 = (unsigned_long)this;
        ht.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar25;
        bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                  ((item_reference<bv::internal::packed_view<std::vector>_> *)&ht,
                   (gaps->
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar17].first);
        ht.sigma_0 = (unsigned_long)local_f0;
        ht.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar25;
        bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                  ((item_reference<bv::internal::packed_view<std::vector>_> *)&ht,uVar13);
        bVar7 = this->prefix_length;
      }
    }
  }
  ::std::
  __sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long,unsigned_char>*,std::vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bwtil::cgap_dictionary::cgap_dictionary(std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>)::_lambda(std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::tuple<unsigned_long,unsigned_long,unsigned_char>)_1_>>
            ((this->H_long).
             super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->H_long).
             super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&codes);
  return;
}

Assistant:

cgap_dictionary(vector<pair<ulint,ulint> > gaps){

		assert(gaps.size()>0);

		//if there is only 1 distinct gap, this creates problems with the huffman codes ...
		//in this case, create one fake gap. There will be 2 codes: 0 and 1
		if(gaps.size()==1)
			gaps.push_back({gaps[0].first+1,1});

		//compute u and n
		ulint u=0;
		ulint n=0;

		ulint max_gap=0;

		for(auto g : gaps){

			assert(g.first>0);
			assert(g.second>0);

			u += (g.first*g.second);
			n += g.second;

			if(g.first>max_gap)
				max_gap=g.first;

		}

		log2_max_gap = intlog2(max_gap);

		//build Huffman tree and retrieve boolean codes
		vector<vector<bool> > codes;

		{
			vector<ulint> freqs;

			for(auto g : gaps)
				freqs.push_back(g.second);

			HuffmanTree<ulint> ht(freqs);

			codes = ht.getCodes();

			for(auto c : codes){

				//make sure that no code is longer than 63 bits
				assert(c.size()<sizeof(ulint)*8);

			}

		}

		assert(codes.size()==gaps.size());

		{
			//count long codes
			vector<ulint> long_codes(64,0);
			for(auto c : codes)
				for(ulint i=0;i<c.size();++i)
					long_codes[i]++;

			//just for testing purposes: code_freq[i] contains the cumulative
			//frequency of codes having length <= i
			vector<double> code_freq(64,0);
			for(ulint i=0;i<codes.size();++i)
				code_freq[codes[i].size()]+=gaps[i].second;
			for(ulint i=1;i<code_freq.size();++i)
				code_freq[i] += code_freq[i-1];
			for(ulint i=0;i<code_freq.size();++i)
				code_freq[i] = 100*code_freq[i]/n;

			//compute optimal prefix length for the hash table,
			//i.e. prefix length that minimizes overall size of the dictionary

			prefix_length=1;
			ulint opt_bitsize = ulint(1)<<63;

			//for efficiency reasons, we limit the maximum prefix length to 30 (in order to avoid
			//huge dictionaries)
			for(ulint p=1;p<30;++p){

				//cout << p << " " << code_freq[p] << " " << long_codes[p] << " " << assess_bitsize(p,long_codes[p]) << endl;

				if(assess_bitsize(p,long_codes[p])<opt_bitsize){

					opt_bitsize = assess_bitsize(p,long_codes[p]);
					prefix_length = p;

				}

			}

			//now choose largest prefix that exceeds at most 20% the optimal bitsize
			ulint max_allowed_bitsize = opt_bitsize + (20*opt_bitsize)/100;

			//cout << "opt p = " << (uint)prefix_length << endl;
			//cout << "opt bitsize = " << opt_bitsize << endl;
			//cout << "max bitsize = " << max_allowed_bitsize << endl;

			for(ulint p=1;p<30;++p){

				if(assess_bitsize(p,long_codes[p])<=max_allowed_bitsize)
					prefix_length = p;

			}

			//cout << "optimal prefix_length = " << (ulint)prefix_length<<endl;
			//cout << "with the hash table we catch " << code_freq[prefix_length] << "% of the codes!"<<endl;

		}

		//build the code function
		for(ulint i=0;i<codes.size();++i)
			encoding[gaps[i].first] = codes[i];

		ulint H_size = ulint(1)<<prefix_length;

		H_val = packed_view<vector>(log2_max_gap,H_size);
		H_len = packed_view<vector>(intlog2(prefix_length),H_size);

		for(ulint i=0;i<H_size;++i) H_len[i] = 0;

		//build hash

		//store here triples of the form <code,gap value,code length>
		//where code is the left-shifted Huffman code

		for(ulint i=0;i<gaps.size();++i){

			//code length
			auto l = codes[i].size();
			assert(l>0);

			if(l<=prefix_length){

				//the hash is sufficient to decode this code. Compute H entry
				ulint h = 0;

				for(auto b : codes[i])
					h = h*2+b;

				//shift to left so to occupy exactly prefix_length bits
				h = h << (prefix_length-l);

				//fill all combinations of h followed by any bit sequence (in total prefix_length bits)
				for(ulint j=0;j<(ulint(1)<<(prefix_length-l));++j){
					H_val[h+j] = gaps[i].first;
					H_len[h+j] = l;
				}

			}else{

				//pack the code in a memory word
				ulint h = 0;

				for(uint j=0;j<codes[i].size();++j)
					h = h*2 + codes[i][j];

				//left-shift
				h = h << (sizeof(ulint)*8-codes[i].size());

				H_long.push_back(triple(h,gaps[i].first,(uint8_t)codes[i].size()));

			}

		}

		auto comp = [](triple x, triple y){ return std::get<0>(x) < std::get<0>(y); };
		std::sort(H_long.begin(),H_long.end(),comp);

		assert(log2_max_gap>0);

	}